

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>::
UntypedDescribeUninterestingCall
          (FunctionMockerBase<void_(int,_int,_mp::ComplInfo)> *this,void *untyped_args,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  ostream *in_RDX;
  tuple<int,_int,_mp::ComplInfo> *in_RDI;
  ArgumentTuple *args;
  ostream *in_stack_ffffffffffffffc8;
  
  std::operator<<(in_RDX,"Uninteresting mock function call - ");
  DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,os);
  poVar1 = std::operator<<(in_RDX,"    Function call: ");
  pcVar2 = UntypedFunctionMockerBase::Name((UntypedFunctionMockerBase *)os);
  std::operator<<(poVar1,pcVar2);
  UniversalPrint<std::tuple<int,int,mp::ComplInfo>>(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    *os << "Uninteresting mock function call - ";
    DescribeDefaultActionTo(args, os);
    *os << "    Function call: " << Name();
    UniversalPrint(args, os);
  }